

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O2

void Eigen::internal::
     dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_1,_0>
     ::run(generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *kernel)

{
  DstEvaluatorType *pDVar1;
  SrcEvaluatorType *pSVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = (kernel->m_dstExpr->m_matrix).
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
          m_cols.m_value;
  pDVar1 = kernel->m_dst;
  pSVar2 = kernel->m_src;
  lVar4 = 0;
  if (lVar3 < 1) {
    lVar3 = lVar4;
  }
  for (; lVar3 != lVar4; lVar4 = lVar4 + 1) {
    (pDVar1->
    super_unary_evaluator<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_Eigen::internal::IndexBased,_double>
    ).m_argImpl.super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
    super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
    .m_data[(pDVar1->
            super_unary_evaluator<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_Eigen::internal::IndexBased,_double>
            ).m_argImpl.
            super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
            super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
            .m_innerStride.m_value * lVar4] =
         (pSVar2->super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>)
         .m_d.data[lVar4];
  }
  return;
}

Assistant:

Index size() const EIGEN_NOEXCEPT { return m_dstExpr.size(); }